

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O0

void __thiscall
soplex::SPxBasisBase<double>::multBaseWith
          (SPxBasisBase<double> *this,SSVectorBase<double> *x,SSVectorBase<double> *result)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  undefined4 in_EDX;
  int __c;
  undefined4 in_register_00000014;
  SSVectorBase<double> *in_RSI;
  long *in_RDI;
  SVectorBase<double> *unaff_retaddr;
  double in_stack_00000008;
  SSVectorBase<double> *in_stack_00000010;
  int i_1;
  int idx;
  int i;
  int in_stack_ffffffffffffff9c;
  SSVectorBase<double> *in_stack_ffffffffffffffa0;
  int local_24;
  uint local_1c;
  
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    (**(code **)(*in_RDI + 0x28))(in_RDI,in_RDI + 0x1a);
  }
  SSVectorBase<double>::clear(in_stack_ffffffffffffffa0);
  bVar1 = SSVectorBase<double>::isSetup(in_RSI);
  if (bVar1) {
    for (local_1c = 0; iVar2 = SSVectorBase<double>::size((SSVectorBase<double> *)0x24773f),
        (int)local_1c < iVar2; local_1c = local_1c + 1) {
      pcVar3 = SSVectorBase<double>::index(in_RSI,(char *)(ulong)local_1c,__c);
      SSVectorBase<double>::operator[](in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      DataArray<const_soplex::SVectorBase<double>_*>::operator[]
                ((DataArray<const_soplex::SVectorBase<double>_*> *)(in_RDI + 5),(int)pcVar3);
      SSVectorBase<double>::multAdd<double,double>
                (in_stack_00000010,in_stack_00000008,unaff_retaddr);
    }
  }
  else {
    for (local_24 = 0; iVar2 = SSVectorBase<double>::dim((SSVectorBase<double> *)0x2477c7),
        local_24 < iVar2; local_24 = local_24 + 1) {
      SSVectorBase<double>::operator[]
                ((SSVectorBase<double> *)CONCAT44(in_register_00000014,in_EDX),
                 in_stack_ffffffffffffff9c);
      DataArray<const_soplex::SVectorBase<double>_*>::operator[]
                ((DataArray<const_soplex::SVectorBase<double>_*> *)(in_RDI + 5),local_24);
      SSVectorBase<double>::multAdd<double,double>
                (in_stack_00000010,in_stack_00000008,unaff_retaddr);
    }
  }
  return;
}

Assistant:

void SPxBasisBase<R>::multBaseWith(SSVectorBase<R>& x, SSVectorBase<R>& result) const
{
   assert(status() > SINGULAR);
   assert(theLP->dim() == x.dim());
   assert(x.dim() == result.dim());

   if(!matrixIsSetup)
      (const_cast<SPxBasisBase<R>*>(this))->loadDesc(thedesc);

   assert(matrixIsSetup);

   result.clear();

   if(x.isSetup())
   {
      for(int i = 0; i < x.size(); ++i)
      {
         int idx = x.index(i);
         result.multAdd(x[idx], (*matrix[idx]));
      }
   }
   else
   {
      for(int i = 0; i < x.dim(); ++i)
         result.multAdd(x[i], (*matrix[i]));
   }

   return;
}